

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

int nh_ws_handshake(http_context_t *ctx)

{
  uint8_t *puVar1;
  int iVar2;
  uchar *dest;
  http_string_t hVar3;
  uchar auStack_78 [8];
  char raw [61];
  uchar sha1_encoded [21];
  
  if ((ctx->version != HTTP_1_0) &&
     (hVar3.value = (ctx->raw).buf + (ctx->method).index, hVar3.len._0_4_ = (ctx->method).len,
     hVar3.len._4_4_ = 0, iVar2 = string_cmp_chars_case_insensitive(hVar3,"GET"), iVar2 != 0)) {
    hVar3 = get_request_header(ctx,"Connection");
    iVar2 = string_cmp_chars_case_insensitive(hVar3,"upgrade");
    if (iVar2 != 0) {
      hVar3 = get_request_header(ctx,"Upgrade");
      iVar2 = string_cmp_chars_case_insensitive(hVar3,"websocket");
      if (iVar2 != 0) {
        hVar3 = get_request_header(ctx,"Sec-WebSocket-Version");
        iVar2 = string_cmp_chars_case_insensitive(hVar3,"13");
        if (iVar2 != 0) {
          hVar3 = get_request_header(ctx,"Sec-WebSocket-Key");
          if (hVar3.len == 0x18) {
            puVar1 = &ctx->session->flags;
            *puVar1 = *puVar1 | 4;
            raw[0x28] = '\0';
            raw[0x29] = '\0';
            raw[0x2a] = '\0';
            raw[0x2b] = '\0';
            raw[0x2c] = '\0';
            raw[0x2d] = '\0';
            raw[0x2e] = '\0';
            raw[0x2f] = '\0';
            raw[0x30] = '\0';
            raw[0x31] = '\0';
            raw[0x32] = '\0';
            raw[0x33] = '\0';
            raw[0x34] = '\0';
            raw[0x18] = '\0';
            raw[0x19] = '\0';
            raw[0x1a] = '\0';
            raw[0x1b] = '\0';
            raw[0x1c] = '\0';
            raw[0x1d] = '\0';
            raw[0x1e] = '\0';
            raw[0x1f] = '\0';
            raw[0x20] = '\0';
            raw[0x21] = '\0';
            raw[0x22] = '\0';
            raw[0x23] = '\0';
            raw[0x24] = '\0';
            raw[0x25] = '\0';
            raw[0x26] = '\0';
            raw[0x27] = '\0';
            raw[8] = '\0';
            raw[9] = '\0';
            raw[10] = '\0';
            raw[0xb] = '\0';
            raw[0xc] = '\0';
            raw[0xd] = '\0';
            raw[0xe] = '\0';
            raw[0xf] = '\0';
            raw[0x10] = '\0';
            raw[0x11] = '\0';
            raw[0x12] = '\0';
            raw[0x13] = '\0';
            raw[0x14] = '\0';
            raw[0x15] = '\0';
            raw[0x16] = '\0';
            raw[0x17] = '\0';
            auStack_78[0] = '\0';
            auStack_78[1] = '\0';
            auStack_78[2] = '\0';
            auStack_78[3] = '\0';
            auStack_78[4] = '\0';
            auStack_78[5] = '\0';
            auStack_78[6] = '\0';
            auStack_78[7] = '\0';
            raw[0] = '\0';
            raw[1] = '\0';
            raw[2] = '\0';
            raw[3] = '\0';
            raw[4] = '\0';
            raw[5] = '\0';
            raw[6] = '\0';
            raw[7] = '\0';
            stack0xffffffffffffffc8 = 0;
            strncpy((char *)auStack_78,hVar3.value,0x18);
            raw[0x30] = '5';
            raw[0x31] = 'B';
            raw[0x32] = '1';
            raw[0x33] = '1';
            raw[0x34] = '\0';
            raw[0x10] = '2';
            raw[0x11] = '5';
            raw[0x12] = '8';
            raw[0x13] = 'E';
            raw[0x14] = 'A';
            raw[0x15] = 'F';
            raw[0x16] = 'A';
            raw[0x17] = '5';
            raw[0x18] = '-';
            raw[0x19] = 'E';
            raw[0x1a] = '9';
            raw[0x1b] = '1';
            raw[0x1c] = '4';
            raw[0x1d] = '-';
            raw[0x1e] = '4';
            raw[0x1f] = '7';
            raw[0x20] = 'D';
            raw[0x21] = 'A';
            raw[0x22] = '-';
            raw[0x23] = '9';
            raw[0x24] = '5';
            raw[0x25] = 'C';
            raw[0x26] = 'A';
            raw[0x27] = '-';
            raw[0x28] = 'C';
            raw[0x29] = '5';
            raw[0x2a] = 'A';
            raw[0x2b] = 'B';
            raw[0x2c] = '0';
            raw[0x2d] = 'D';
            raw[0x2e] = 'C';
            raw[0x2f] = '8';
            SHA1(auStack_78,0x3c,(uchar *)(raw + 0x38));
            dest = (uchar *)malloc(0x1f);
            bind_with_context(ctx,dest);
            nh_base64_encode((uchar *)(raw + 0x38),0x14,dest);
            (ctx->response).status = 0x65;
            set_response_header(ctx,"Upgrade","websocket");
            set_response_header(ctx,"Connection","Upgrade");
            set_response_header(ctx,"Sec-WebSocket-Accept",(char *)dest);
            nh_stream_init(&(ctx->response).raw);
            nh_generate_http_response(ctx);
            nh_session_write(ctx->session);
            return 1;
          }
        }
      }
    }
  }
  (ctx->response).status = 400;
  return 0;
}

Assistant:

int nh_ws_handshake(http_context_t *ctx) {
    http_string_t key;
    if (ctx->version == HTTP_1_0
        || !string_cmp_chars_case_insensitive(get_request_method(ctx), "GET")
        || !string_cmp_chars_case_insensitive(get_request_header(ctx, "Connection"), "upgrade")
        || !string_cmp_chars_case_insensitive(get_request_header(ctx, "Upgrade"), "websocket")
        || !string_cmp_chars_case_insensitive(get_request_header(ctx, "Sec-WebSocket-Version"), "13")
        // skip check about Sec-WebSocket-Protocol and Sec-WebSocket-Extension
        // base64(16bit) = 24bit
        || (key = get_request_header(ctx, "Sec-WebSocket-Key")).len != 24) {
        set_response_status(ctx, 400);
        return 0;
    }

    // set flag upgraded
    FLAG_SET(ctx->session->flags, SESSION_FLAG_UPGRADED);
    char raw[61] = {0};
    unsigned char sha1_encoded[SHA_DIGEST_LENGTH + 1] = {0};
    strncpy(raw, key.value, 24);
    strcpy(&raw[24], WEBSOCKET_MAGIC_NUMBER);
    SHA1((unsigned char const *) raw, 60, (unsigned char *) sha1_encoded);
    char *result = (char *) bind_with_context(ctx, malloc(sizeof(char) * 31));
    nh_base64_encode(sha1_encoded, SHA_DIGEST_LENGTH, (unsigned char *) result);
    set_response_status(ctx, 101);
    set_response_header(ctx, "Upgrade", "websocket");
    set_response_header(ctx, "Connection", "Upgrade");
    set_response_header(ctx, "Sec-WebSocket-Accept", result);

    nh_stream_init(&ctx->response.raw);
    nh_generate_http_response(ctx);
    nh_session_write(ctx->session);

    return 1;
}